

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_3dPoint * __thiscall
ON_Mesh::Vertex(ON_3dPoint *__return_storage_ptr__,ON_Mesh *this,int vertex_index)

{
  float fVar1;
  float fVar2;
  ON_3fPoint *pOVar3;
  ON_3dPoint *pOVar4;
  ON_3dPoint *D;
  undefined1 local_24 [8];
  ON_3fPoint F;
  uint vertex_count;
  int vertex_index_local;
  ON_Mesh *this_local;
  
  F.z = (float)vertex_index;
  F.y = (float)ON_SimpleArray<ON_3fPoint>::UnsignedCount
                         (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  if (((int)F.z < 0) || ((uint)F.y <= (uint)F.z)) {
    __return_storage_ptr__->x = ON_3dPoint::UnsetPoint.x;
    __return_storage_ptr__->y = ON_3dPoint::UnsetPoint.y;
    __return_storage_ptr__->z = ON_3dPoint::UnsetPoint.z;
  }
  else {
    pOVar3 = ON_SimpleArray<ON_3fPoint>::operator[]
                       (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,(int)F.z);
    fVar1 = F.y;
    local_24._0_4_ = pOVar3->x;
    local_24._4_4_ = pOVar3->y;
    F.x = pOVar3->z;
    fVar2 = (float)ON_SimpleArray<ON_3dPoint>::UnsignedCount
                             (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
    if (fVar1 == fVar2) {
      pOVar4 = ON_SimpleArray<ON_3dPoint>::operator[]
                         (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,(int)F.z);
      __return_storage_ptr__->x = pOVar4->x;
      __return_storage_ptr__->y = pOVar4->y;
      __return_storage_ptr__->z = pOVar4->z;
      if (((float)local_24._0_4_ == (float)__return_storage_ptr__->x) &&
         (!NAN((float)local_24._0_4_) && !NAN((float)__return_storage_ptr__->x))) {
        if (((float)local_24._4_4_ == (float)__return_storage_ptr__->y) &&
           (!NAN((float)local_24._4_4_) && !NAN((float)__return_storage_ptr__->y))) {
          if ((F.x == (float)__return_storage_ptr__->z) &&
             (!NAN(F.x) && !NAN((float)__return_storage_ptr__->z))) {
            return __return_storage_ptr__;
          }
        }
      }
    }
    ON_3dPoint::ON_3dPoint(__return_storage_ptr__,(ON_3fPoint *)local_24);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_Mesh::Vertex(int vertex_index) const
{
  const unsigned int vertex_count = m_V.UnsignedCount();
  if ( vertex_index < 0 || ((unsigned int)vertex_index) >= vertex_count )
    return ON_3dPoint::UnsetPoint;

  const ON_3fPoint F = m_V[vertex_index];
  if (vertex_count == m_dV.UnsignedCount())
  {
    ON_3dPoint D = m_dV[vertex_index];
    if ( F.x == (float)D.x && F.y == (float)D.y && F.z == (float)D.z )
    {
      // double precision vertex is valid
      return D;
    }
  }

  return F;
}